

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int yyGrowStack(yyParser *p)

{
  int iVar1;
  int iVar2;
  void *__dest;
  long *in_RDI;
  yyStackEntry *pNew;
  int idx;
  int newSize;
  int oldSize;
  undefined4 in_stack_ffffffffffffffe0;
  
  iVar1 = (int)((in_RDI[2] - in_RDI[3]) / 0x18) + 1;
  iVar2 = (int)((*in_RDI - in_RDI[3]) / 0x18);
  if ((long *)in_RDI[3] == in_RDI + 4) {
    __dest = parserStackRealloc((void *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),0xaaaaaaaaaaaaaaaa
                               );
    if (__dest == (void *)0x0) {
      return 1;
    }
    memcpy(__dest,(void *)in_RDI[3],(long)iVar1 * 0x18);
  }
  else {
    __dest = parserStackRealloc((void *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),0xaaaaaaaaaaaaaaaa
                               );
    if (__dest == (void *)0x0) {
      return 1;
    }
  }
  in_RDI[3] = (long)__dest;
  *in_RDI = in_RDI[3] + (long)iVar2 * 0x18;
  in_RDI[2] = in_RDI[3] + (long)(iVar1 * 2 + 99) * 0x18;
  return 0;
}

Assistant:

static int yyGrowStack(yyParser *p){
  int oldSize = 1 + (int)(p->yystackEnd - p->yystack);
  int newSize;
  int idx;
  yyStackEntry *pNew;

  newSize = oldSize*2 + 100;
  idx = (int)(p->yytos - p->yystack);
  if( p->yystack==p->yystk0 ){
    pNew = YYREALLOC(0, newSize*sizeof(pNew[0]));
    if( pNew==0 ) return 1;
    memcpy(pNew, p->yystack, oldSize*sizeof(pNew[0]));
  }else{
    pNew = YYREALLOC(p->yystack, newSize*sizeof(pNew[0]));
    if( pNew==0 ) return 1;
  }
  p->yystack = pNew;
  p->yytos = &p->yystack[idx];
#ifndef NDEBUG
  if( yyTraceFILE ){
    fprintf(yyTraceFILE,"%sStack grows from %d to %d entries.\n",
            yyTracePrompt, oldSize, newSize);
  }
#endif
  p->yystackEnd = &p->yystack[newSize-1];
  return 0;
}